

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

int32_t __thiscall helics::CommonCore::getFederationSize(CommonCore *this)

{
  int32_t iVar1;
  handle local_20;
  
  if ((this->super_BrokerBase).brokerState._M_i < OPERATING) {
    gmlc::libguarded::
    shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::lock(&local_20,&this->federates);
    iVar1 = (int32_t)((ulong)((long)((local_20.data)->dataStorage).
                                    super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)((local_20.data)->dataStorage).
                                   super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_20.m_handle_lock);
  }
  else {
    iVar1 = this->mGlobalFederationSize;
  }
  return iVar1;
}

Assistant:

int32_t CommonCore::getFederationSize()
{
    if (getBrokerState() >= BrokerState::OPERATING) {
        return mGlobalFederationSize;
    }
    // if we are in initialization return the local federation size
    return static_cast<int32_t>(federates.lock()->size());
}